

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateNonbasicValue
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *objChange)

{
  byte bVar1;
  cpp_dec_float<50U,_int,_void> local_40;
  
  bVar1 = this->m_nonbasicValueUpToDate;
  if ((bool)bVar1 == true) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              (&(this->m_nonbasicValue).m_backend,&objChange->m_backend);
    bVar1 = this->m_nonbasicValueUpToDate;
  }
  if ((bVar1 & 1) == 0) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_40,-1e+100,(type *)0x0);
  }
  else {
    nonbasicValue((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_40,this);
  }
  return this->m_nonbasicValueUpToDate;
}

Assistant:

bool SPxSolverBase<R>::updateNonbasicValue(R objChange)
   {
      if(m_nonbasicValueUpToDate)
         m_nonbasicValue += objChange;

      SPxOut::debug(this, "Iteration: {} updated objValue: {} new value: {} correct value: {}\n",
                    this->iteration(), objChange, m_nonbasicValue, m_nonbasicValueUpToDate ? nonbasicValue() : -1e100);

      return m_nonbasicValueUpToDate;
   }